

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::on_arg_id(format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
            *this,uint id)

{
  basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char> *in_RDI;
  uint in_stack_ffffffffffffffbc;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_ffffffffffffffc8;
  ostream_type *local_30;
  undefined4 local_28;
  
  internal::
  context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
  ::parse_context((context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
                   *)&(in_RDI->
                      super_context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
                      ).parse_context_.format_str_.size_);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::check_arg_id
            (in_stack_ffffffffffffffc8,(uint)((ulong)in_RDI >> 0x20));
  basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>::get_arg
            (in_RDI,in_stack_ffffffffffffffbc);
  *(basic_parse_context<char,_fmt::v5::internal::error_handler> **)
   &in_RDI[1].
    super_context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
    .parse_context_.next_arg_id_ = in_stack_ffffffffffffffc8;
  in_RDI[1].
  super_context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
  .out_._M_stream = local_30;
  *(undefined4 *)
   &in_RDI[1].
    super_context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
    .out_._M_string = local_28;
  return;
}

Assistant:

void on_arg_id(unsigned id) {
    context.parse_context().check_arg_id(id);
    arg = context.get_arg(id);
  }